

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void X509V3_ext(Curl_easy *data,int certnum,stack_st_X509_EXTENSION *exts)

{
  int iVar1;
  int iVar2;
  OPENSSL_STACK *pOVar3;
  BIO_METHOD *type;
  BIO *out;
  ASN1_OCTET_STRING *v;
  BIO *bio_out;
  char namebuf [128];
  size_t *local_40;
  BUF_MEM *biomem;
  X509_EXTENSION *ext;
  ASN1_OBJECT *obj;
  stack_st_X509_EXTENSION *psStack_20;
  int i;
  stack_st_X509_EXTENSION *exts_local;
  Curl_easy *pCStack_10;
  int certnum_local;
  Curl_easy *data_local;
  
  psStack_20 = exts;
  exts_local._4_4_ = certnum;
  pCStack_10 = data;
  pOVar3 = ossl_check_const_X509_EXTENSION_sk_type(exts);
  iVar1 = OPENSSL_sk_num(pOVar3);
  if (0 < iVar1) {
    obj._4_4_ = 0;
    while( true ) {
      iVar1 = obj._4_4_;
      pOVar3 = ossl_check_const_X509_EXTENSION_sk_type(psStack_20);
      iVar2 = OPENSSL_sk_num(pOVar3);
      if (iVar2 <= iVar1) break;
      pOVar3 = ossl_check_const_X509_EXTENSION_sk_type(psStack_20);
      biomem = (BUF_MEM *)OPENSSL_sk_value(pOVar3,obj._4_4_);
      type = BIO_s_mem();
      out = BIO_new(type);
      if (out == (BIO *)0x0) {
        return;
      }
      ext = (X509_EXTENSION *)X509_EXTENSION_get_object((X509_EXTENSION *)biomem);
      asn1_object_dump((ASN1_OBJECT *)ext,(char *)&bio_out,0x80);
      iVar1 = X509V3_EXT_print(out,(X509_EXTENSION *)biomem,0,0);
      if (iVar1 == 0) {
        v = X509_EXTENSION_get_data((X509_EXTENSION *)biomem);
        ASN1_STRING_print(out,v);
      }
      BIO_ctrl(out,0x73,0,&local_40);
      Curl_ssl_push_certinfo_len
                (pCStack_10,exts_local._4_4_,(char *)&bio_out,(char *)local_40[1],*local_40);
      BIO_free(out);
      obj._4_4_ = obj._4_4_ + 1;
    }
  }
  return;
}

Assistant:

static void X509V3_ext(struct Curl_easy *data,
                      int certnum,
                      CONST_EXTS STACK_OF(X509_EXTENSION) *exts)
{
  int i;

  if((int)sk_X509_EXTENSION_num(exts) <= 0)
    /* no extensions, bail out */
    return;

  for(i = 0; i < (int)sk_X509_EXTENSION_num(exts); i++) {
    ASN1_OBJECT *obj;
    X509_EXTENSION *ext = sk_X509_EXTENSION_value(exts, i);
    BUF_MEM *biomem;
    char namebuf[128];
    BIO *bio_out = BIO_new(BIO_s_mem());

    if(!bio_out)
      return;

    obj = X509_EXTENSION_get_object(ext);

    asn1_object_dump(obj, namebuf, sizeof(namebuf));

    if(!X509V3_EXT_print(bio_out, ext, 0, 0))
      ASN1_STRING_print(bio_out, (ASN1_STRING *)X509_EXTENSION_get_data(ext));

    BIO_get_mem_ptr(bio_out, &biomem);
    Curl_ssl_push_certinfo_len(data, certnum, namebuf, biomem->data,
                               biomem->length);
    BIO_free(bio_out);
  }
}